

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O2

void __thiscall
Secp256k1_AddTweakPubkeySecp256k1EcErrorTest_Test::
~Secp256k1_AddTweakPubkeySecp256k1EcErrorTest_Test
          (Secp256k1_AddTweakPubkeySecp256k1EcErrorTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Secp256k1, AddTweakPubkeySecp256k1EcErrorTest) {
  struct secp256k1_context_struct *cxt = wally_get_secp_context();
  Secp256k1 secp = Secp256k1(cxt);
  for (TweakPubkeyTestVector test_vector : tweak_pubkey_error_vectors) {
    if (test_vector.expect_add.empty()) {
      EXPECT_THROW(
        ByteData actual = secp.AddTweakPubkeySecp256k1Ec(test_vector.pubkey,
          test_vector.tweak, test_vector.is_check),
        CfdException);
    }
    if (test_vector.expect_mul.empty()) {
      EXPECT_THROW(
        ByteData actual = secp.MulTweakPubkeySecp256k1Ec(test_vector.pubkey,
          test_vector.tweak),
        CfdException);
    }
  }
}